

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O2

Vec_Int_t * prepareFlopVector(Aig_Man_t *pAig,int vectorLength)

{
  Vec_Int_t *pVVar1;
  int *__ptr;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  pVVar1 = (Vec_Int_t *)malloc(0x10);
  uVar4 = (ulong)(uint)vectorLength;
  if (vectorLength - 1U < 0xf) {
    uVar4 = 0x10;
  }
  pVVar1->nSize = 0;
  iVar2 = (int)uVar4;
  pVVar1->nCap = iVar2;
  uVar6 = 0;
  if (iVar2 == 0) {
    __ptr = (int *)0x0;
  }
  else {
    __ptr = (int *)malloc((long)iVar2 << 2);
  }
  pVVar1->pArray = __ptr;
  uVar3 = (ulong)(uint)vectorLength;
  if (vectorLength < 1) {
    uVar3 = uVar6;
  }
  do {
    if ((int)uVar3 == (int)uVar6) {
      return pVVar1;
    }
    iVar2 = (int)uVar4;
    if ((int)uVar6 == iVar2) {
      uVar5 = (ulong)(uint)(iVar2 * 2);
      if (iVar2 < 0x10) {
        uVar5 = 0x10;
      }
      if (iVar2 < (int)uVar5) {
        if (__ptr == (int *)0x0) {
          __ptr = (int *)malloc(uVar5 << 2);
        }
        else {
          __ptr = (int *)realloc(__ptr,uVar5 << 2);
        }
        pVVar1->pArray = __ptr;
        if (__ptr == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar1->nCap = (int)uVar5;
        uVar4 = uVar5;
      }
    }
    iVar2 = (int)(uVar6 + 1);
    pVVar1->nSize = iVar2;
    __ptr[uVar6] = iVar2 + -1;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * prepareFlopVector( Aig_Man_t * pAig, int vectorLength )
{
    Vec_Int_t *vFlops;
    int i;

    vFlops = Vec_IntAlloc( vectorLength );

    for( i=0; i<vectorLength; i++ )
        Vec_IntPush( vFlops, i );

#if 0
    Vec_IntPush( vFlops, 19 );
    Vec_IntPush( vFlops, 20 );
    Vec_IntPush( vFlops, 23 );
    Vec_IntPush( vFlops, 24 );
    //Vec_IntPush( vFlops, 2 );
    //Vec_IntPush( vFlops, 3 );
    //Vec_IntPush( vFlops, 4 );
    //Vec_IntPush( vFlops, 5 );
    //Vec_IntPush( vFlops, 8 );
    //Vec_IntPush( vFlops, 9 );
    //Vec_IntPush( vFlops, 10 );
    //Vec_IntPush( vFlops, 11 );
    //Vec_IntPush( vFlops, 0 );
    //Vec_IntPush( vFlops, 0 );
#endif

    return vFlops;
}